

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
* __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::escape_string(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                *this,string_t *s)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  undefined1 *puVar6;
  const_iterator pcVar7;
  char *pcVar8;
  byte *pbVar9;
  char m;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  initializer_list<char> local_80;
  initializer_list<char> *local_70;
  initializer_list<char> *__range6;
  byte *pbStack_60;
  anon_class_1_0_00000001 hexify;
  char *c;
  const_iterator __end0;
  const_iterator __begin0;
  string_t *__range2;
  size_t pos;
  allocator local_22;
  undefined1 local_21;
  size_t local_20;
  size_t space;
  string_t *s_local;
  string_t *result;
  
  space = (size_t)s;
  s_local = (string_t *)this;
  local_20 = extra_space(s);
  if (local_20 == 0) {
    std::__cxx11::string::string((string *)this,(string *)space);
  }
  else {
    local_21 = 0;
    lVar4 = std::__cxx11::string::size();
    uVar5 = lVar4 + local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,uVar5,'\\',&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    __end0._M_current = (char *)std::__cxx11::string::begin();
    c = (char *)std::__cxx11::string::end();
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), bVar3) {
      pbStack_60 = (byte *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&__end0);
      bVar1 = *pbStack_60;
      if (bVar1 == 8) {
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
        *puVar6 = 0x62;
      }
      else if (bVar1 == 9) {
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
        *puVar6 = 0x74;
      }
      else if (bVar1 == 10) {
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
        *puVar6 = 0x6e;
      }
      else if (bVar1 == 0xc) {
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
        *puVar6 = 0x66;
      }
      else if (bVar1 == 0xd) {
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
        *puVar6 = 0x72;
      }
      else if (bVar1 == 0x22) {
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
        *puVar6 = 0x22;
      }
      else if (bVar1 != 0x5c) {
        if (((char)*pbStack_60 < '\0') || ('\x1f' < (char)*pbStack_60)) {
          bVar1 = *pbStack_60;
          pbVar9 = (byte *)std::__cxx11::string::operator[]((ulong)this);
          *pbVar9 = bVar1;
        }
        else {
          __begin0_1._3_1_ = 0x75;
          __begin0_1._4_1_ = 0x30;
          __begin0_1._5_1_ = 0x30;
          __begin0_1._6_1_ =
               escape_string::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&__range6 + 7),(char)*pbStack_60 >> 4);
          __begin0_1._7_1_ =
               escape_string::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&__range6 + 7),*pbStack_60 & 0xf);
          local_80._M_array = (iterator)((long)&__begin0_1 + 3);
          local_80._M_len = 5;
          local_70 = &local_80;
          __end0_1 = std::initializer_list<char>::begin(local_70);
          pcVar7 = std::initializer_list<char>::end(local_70);
          for (; __end0_1 != pcVar7; __end0_1 = __end0_1 + 1) {
            cVar2 = *__end0_1;
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)this);
            *pcVar8 = cVar2;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end0);
    }
  }
  return this;
}

Assistant:

static string_t escape_string(const string_t& s)
        {
            const auto space = extra_space(s);
            if (space == 0)
            {
                return s;
            }

            // create a result string of necessary size
            string_t result(s.size() + space, '\\');
            std::size_t pos = 0;

            for (const auto& c : s)
            {
                switch (c)
                {
                    // quotation mark (0x22)
                    case '"':
                    {
                        result[pos + 1] = '"';
                        pos += 2;
                        break;
                    }

                        // reverse solidus (0x5c)
                    case '\\':
                    {
                        // nothing to change
                        pos += 2;
                        break;
                    }

                        // backspace (0x08)
                    case '\b':
                    {
                        result[pos + 1] = 'b';
                        pos += 2;
                        break;
                    }

                        // formfeed (0x0c)
                    case '\f':
                    {
                        result[pos + 1] = 'f';
                        pos += 2;
                        break;
                    }

                        // newline (0x0a)
                    case '\n':
                    {
                        result[pos + 1] = 'n';
                        pos += 2;
                        break;
                    }

                        // carriage return (0x0d)
                    case '\r':
                    {
                        result[pos + 1] = 'r';
                        pos += 2;
                        break;
                    }

                        // horizontal tab (0x09)
                    case '\t':
                    {
                        result[pos + 1] = 't';
                        pos += 2;
                        break;
                    }

                    default:
                    {
                        if (c >= 0x00 and c <= 0x1f)
                        {
                            // convert a number 0..15 to its hex representation
                            // (0..f)
                            auto hexify = [](const char v) -> char
                            {
                                return (v < 10) ? ('0' + v) : ('a' + v - 10);
                            };

                            // print character c as \uxxxx
                            for (const char m :
                                    { 'u', '0', '0', hexify(c >> 4), hexify(c & 0x0f)
                                    })
                            {
                                result[++pos] = m;
                            }

                            ++pos;
                        }
                        else
                        {
                            // all other characters are added as-is
                            result[pos++] = c;
                        }
                        break;
                    }
                }
            }

            return result;
        }